

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::readFile(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  ulong uVar1;
  uint uVar2;
  uint dst;
  allocator<char> local_51;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  vector<char,_std::allocator<char>_> readBuffer;
  
  requireDStackDepth(this,3,"READ-FILE");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&readBuffer,"READ-FILE",&local_51);
  GetFileHandle((Forth *)&f,(Cell)this,(string *)(ulong)uVar2,(errorCodes)&readBuffer);
  std::__cxx11::string::~string((string *)&readBuffer);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  dst = ForthStack<unsigned_int>::getTop(this_00,1);
  std::vector<char,_std::allocator<char>_>::vector(&readBuffer,(ulong)uVar2,&local_51);
  std::ios::clear((int)f.
                       super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr +
                  (int)*(undefined8 *)
                        (*(long *)f.
                                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + -0x18));
  std::istream::read((char *)f.
                             super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,
                     (long)readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  uVar1 = *(ulong *)(f.
                     super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr + 8);
  moveIntoDataSpace(this,dst,readBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,uVar1 & 0xffffffff);
  ForthStack<unsigned_int>::setTop
            (this_00,-(*(uint *)(f.
                                 super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr +
                                *(long *)(*(long *)f.
                                                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr + -0x18) + 0x20) & 1) & 0xffffffba);
  ForthStack<unsigned_int>::setTop(this_00,1,(uint)uVar1);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&readBuffer.super__Vector_base<char,_std::allocator<char>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void readFile() {
	REQUIRE_DSTACK_DEPTH(3, "READ-FILE");
	auto h = (dStack.getTop()); pop();
	auto f = GetFileHandle(h, "READ-FILE", errorReadFile);
	auto length = SIZE_T(dStack.getTop());
	auto caddr = (dStack.getTop(1));
	std::vector<char> readBuffer(length);
	f->clear();
	f->read(&readBuffer[0], static_cast<std::streamsize>(length));
	auto status = f->rdstate();
	auto realLength = static_cast<Cell>(std::strlen(&readBuffer[0]));
	auto realLengthF = CELL(f->gcount());
	moveIntoDataSpace(caddr, &readBuffer[0], realLengthF);
	dStack.setTop(f->bad() ? Cell(errorReadFile) : 0);
	dStack.setTop(1, realLengthF);
}